

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RandomGraphGenerator.cpp
# Opt level: O0

bool __thiscall
ADS::RandomGraphGenerator::addEdges
          (RandomGraphGenerator *this,Graph<unsigned_int> *pGraph,uint uiNVerteces,uint uiNEdges)

{
  bool bVar1;
  uint uVar2;
  uint uiDstKey;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  uint uiCost;
  uint uiDst;
  uint uiSrc;
  uint uiNEdges_local;
  uint uiNVerteces_local;
  Graph<unsigned_int> *pGraph_local;
  RandomGraphGenerator *this_local;
  
  if (pGraph == (Graph<unsigned_int> *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    while (uVar2 = Graph<unsigned_int>::getEdgeCount(pGraph), uVar2 < uiNEdges) {
      random();
      uVar2 = (uint)(long)extraout_XMM0_Da;
      random();
      uiDstKey = (uint)(long)extraout_XMM0_Da_00;
      if (uVar2 != uiDstKey) {
        random();
        bVar1 = Graph<unsigned_int>::hasEdge(pGraph,uVar2,uiDstKey);
        if (!bVar1) {
          Graph<unsigned_int>::addEdge(pGraph,uVar2,uiDstKey,(uint)(long)extraout_XMM0_Da_01);
        }
      }
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool RandomGraphGenerator::addEdges (Graph<unsigned int> *pGraph,
                                     unsigned int uiNVerteces,
                                     unsigned int uiNEdges)
{
    if (pGraph == NULL)
        return false;

    while (pGraph->getEdgeCount() < uiNEdges) {
        unsigned int uiSrc = static_cast<unsigned int>(random (uiNVerteces));
        unsigned int uiDst = static_cast<unsigned int>(random (uiNVerteces));
        
        if (uiSrc == uiDst) {
            /* do not add edges to itself */
            continue;
        }

        unsigned int uiCost = random (EDGE_MIN_COST, EDGE_MAX_COST);

        if (!pGraph->hasEdge (uiSrc, uiDst))
            pGraph-> addEdge (uiSrc, uiDst, uiCost);
    }

    return true;
}